

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void av1_build_intra_predictors_for_interintra
               (AV1_COMMON *cm,MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane,BUFFER_SET *ctx,
               uint8_t *dst,int dst_stride)

{
  undefined7 in_register_00000011;
  
  av1_predict_intra_block
            (xd,cm->seq_params->sb_size,(uint)cm->seq_params->enable_intra_edge_filter,
             (uint)xd->plane[plane].width,(uint)xd->plane[plane].height,
             ""[av1_ss_size_lookup[CONCAT71(in_register_00000011,bsize) & 0xffffffff]
                [xd->plane[plane].subsampling_x][xd->plane[plane].subsampling_y]],
             ""[(*xd->mi)->interintra_mode],0,0,'\x05',ctx->plane[plane],ctx->stride[plane],dst,
             dst_stride,0,0,plane);
  return;
}

Assistant:

void av1_build_intra_predictors_for_interintra(const AV1_COMMON *cm,
                                               MACROBLOCKD *xd,
                                               BLOCK_SIZE bsize, int plane,
                                               const BUFFER_SET *ctx,
                                               uint8_t *dst, int dst_stride) {
  struct macroblockd_plane *const pd = &xd->plane[plane];
  const int ssx = xd->plane[plane].subsampling_x;
  const int ssy = xd->plane[plane].subsampling_y;
  BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ssx, ssy);
  PREDICTION_MODE mode = interintra_to_intra_mode[xd->mi[0]->interintra_mode];
  assert(xd->mi[0]->angle_delta[PLANE_TYPE_Y] == 0);
  assert(xd->mi[0]->angle_delta[PLANE_TYPE_UV] == 0);
  assert(xd->mi[0]->filter_intra_mode_info.use_filter_intra == 0);
  assert(xd->mi[0]->use_intrabc == 0);
  const SequenceHeader *seq_params = cm->seq_params;

  av1_predict_intra_block(xd, seq_params->sb_size,
                          seq_params->enable_intra_edge_filter, pd->width,
                          pd->height, max_txsize_rect_lookup[plane_bsize], mode,
                          0, 0, FILTER_INTRA_MODES, ctx->plane[plane],
                          ctx->stride[plane], dst, dst_stride, 0, 0, plane);
}